

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

size_t __thiscall
bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
          (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *this,size_t index,bool bit)

{
  _Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false> this_00;
  subtree_const_ref t;
  size_t sVar1;
  undefined7 in_register_00000011;
  
  this_00._M_head_impl =
       (this->_impl)._M_t.
       super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
       .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
       _M_head_impl;
  t._index = 0;
  t._vector = this_00._M_head_impl;
  t._height = (this_00._M_head_impl)->height;
  t._size = (this_00._M_head_impl)->size;
  t._rank = (this_00._M_head_impl)->rank;
  sVar1 = internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
                    (this_00._M_head_impl,t,index,0);
  if ((int)CONCAT71(in_register_00000011,bit) == 0) {
    sVar1 = index - sVar1;
  }
  return sVar1;
}

Assistant:

inline
    size_t bitvector_t<W, AP>::rank(size_t index, bool bit) const
    {
        assert(valid() && "Can't access an uninitialized vector");
        size_t rank = _impl->getrank(_impl->root(), index, 0);

        if(!bit)
            rank = index - rank;
            
        return rank;
    }